

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::CutpoolPropagation::markPropagateCut(CutpoolPropagation *this,HighsInt cut)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar4;
  reference this_01;
  reference pvVar5;
  byte *pbVar6;
  int in_ESI;
  value_type_conflict2 *in_RDI;
  double dVar7;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                      (long)in_ESI);
  if (*pvVar2 == '\0') {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)in_ESI);
    if (*pvVar3 != 1) {
      this_00 = HighsCutPool::getRhs(*(HighsCutPool **)(in_RDI + 4));
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)in_ESI);
      dVar1 = *pvVar4;
      this_01 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                          ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 6),
                           (long)in_ESI);
      dVar7 = HighsCDouble::operator_cast_to_double(this_01);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),(long)in_ESI);
      if (*pvVar5 < dVar1 - dVar7) {
        return;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               in_RDI);
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                        (long)in_ESI);
    *pbVar6 = *pbVar6 | 1;
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::markPropagateCut(HighsInt cut) {
  if (!propagatecutflags_[cut] &&
      (activitycutsinf_[cut] == 1 ||
       (cutpool->getRhs()[cut] - double(activitycuts_[cut]) <=
        capacityThreshold_[cut]))) {
    propagatecutinds_.push_back(cut);
    propagatecutflags_[cut] |= 1;
  }
}